

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall
Hospital::Update_Nurses_Time_Table_File
          (Hospital *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *Nurses_Timetable,ofstream *inFile)

{
  reference this_00;
  reference pvVar1;
  ostream *poVar2;
  int local_234;
  int local_230;
  int j;
  int i;
  ostream local_220 [8];
  ofstream abus;
  ofstream *inFile_local;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *Nurses_Timetable_local;
  Hospital *this_local;
  
  system("pause");
  std::ofstream::ofstream(local_220);
  std::ofstream::open((char *)local_220,0x1312d7);
  for (local_230 = 0; local_230 < 7; local_230 = local_230 + 1) {
    for (local_234 = 0; local_234 < 6; local_234 = local_234 + 1) {
      this_00 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](Nurses_Timetable,(long)local_230);
      pvVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,(long)local_234);
      poVar2 = std::operator<<(local_220,(string *)pvVar1);
      std::operator<<(poVar2," ");
    }
    std::operator<<(local_220,"\n");
  }
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void Hospital::  Update_Nurses_Time_Table_File (vector<vector<string>>& Nurses_Timetable , ofstream& inFile){
    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Nurses_Timetable.txt");
    //abus <<"Asghar";

    for (int i = 0; i < 7; i++) {
        for (int j = 0; j < 6; ++j) {
     //       Nurses_Timetable[i][j].erase(std::remove_if(Nurses_Timetable[i][j].begin(), Nurses_Timetable[i][j].end(), ::isspace), Nurses_Timetable[i][j].end());
            abus << Nurses_Timetable[i][j] << " ";
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}